

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void IntVariableCommand(IResult *pResult,void *pUserData)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RSI;
  IResult *in_RDI;
  long in_FS_OFFSET;
  int Val;
  CIntVariableData *pData;
  char aBuf [1024];
  int local_424;
  char local_408 [144];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = IConsole::IResult::NumArguments(in_RDI);
  if (iVar2 == 0) {
    str_format(local_408,0x400,"Value: %d",(ulong)*(uint *)in_RSI[1]);
    (**(code **)(*(long *)*in_RSI + 200))((long *)*in_RSI,0,"console",local_408);
    in_RDI->m_Value = *(int *)in_RSI[1];
  }
  else {
    local_424 = (*in_RDI->_vptr_IResult[2])(in_RDI,0);
    if (*(int *)(in_RSI + 2) != *(int *)((long)in_RSI + 0x14)) {
      if (local_424 < *(int *)(in_RSI + 2)) {
        local_424 = *(int *)(in_RSI + 2);
      }
      if ((*(int *)((long)in_RSI + 0x14) != 0) && (*(int *)((long)in_RSI + 0x14) < local_424)) {
        local_424 = *(int *)((long)in_RSI + 0x14);
      }
    }
    *(int *)in_RSI[1] = local_424;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void IntVariableCommand(IConsole::IResult *pResult, void *pUserData)
{
	CIntVariableData *pData = (CIntVariableData *)pUserData;

	if(pResult->NumArguments())
	{
		int Val = pResult->GetInteger(0);

		// do clamping
		if(pData->m_Min != pData->m_Max)
		{
			if (Val < pData->m_Min)
				Val = pData->m_Min;
			if (pData->m_Max != 0 && Val > pData->m_Max)
				Val = pData->m_Max;
		}

		*(pData->m_pVariable) = Val;
	}
	else
	{
		char aBuf[1024];
		str_format(aBuf, sizeof(aBuf), "Value: %d", *(pData->m_pVariable));
		pData->m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);
		pResult->m_Value = *(pData->m_pVariable);
	}
}